

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

ExecutionResult *
fold(ExecutionResult *__return_storage_ptr__,
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l,
    longlong start,_func_longlong_longlong_longlong *llf,_func_double_double_double *df,
    bool start_with_first)

{
  bool bVar1;
  bool bVar2;
  reference psVar3;
  eval_error *this;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  byte local_209;
  shared_ptr<SchemeInt> local_1e0;
  shared_ptr<SchemeObject> local_1d0;
  shared_ptr<SchemeObject> local_1c0;
  shared_ptr<SchemeFloat> local_1b0;
  shared_ptr<SchemeObject> local_1a0;
  shared_ptr<SchemeObject> local_190;
  shared_ptr<SchemeInt> local_180;
  shared_ptr<SchemeInt> local_170;
  shared_ptr<SchemeInt> local_160;
  shared_ptr<SchemeFloat> local_150;
  shared_ptr<SchemeObject> local_140;
  undefined4 local_12c;
  shared_ptr<SchemeInt> local_128;
  shared_ptr<SchemeFloat> local_118;
  shared_ptr<SchemeObject> local_108;
  undefined1 local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_a9;
  shared_ptr<SchemeObject> local_a8 [2];
  shared_ptr<SchemeObject> local_88;
  undefined1 local_78 [8];
  shared_ptr<SchemeObject> i;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *__range1;
  double dStack_48;
  bool is_double;
  double d;
  longlong n;
  bool start_with_first_local;
  _func_double_double_double *df_local;
  _func_longlong_longlong_longlong *llf_local;
  longlong start_local;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l_local;
  
  dStack_48 = (double)start;
  bVar1 = false;
  __end1 = std::__cxx11::
           list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
           begin(l);
  i.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::
       list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::end(l);
  d = (double)start;
  n._7_1_ = start_with_first;
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&i.
                                              super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
    if (!bVar2) {
      if (bVar1) {
        std::make_shared<SchemeFloat,double&>((double *)&local_1b0);
        std::shared_ptr<SchemeObject>::shared_ptr<SchemeFloat,void>(&local_1a0,&local_1b0);
        to_object(&local_190);
        ExecutionResult::ExecutionResult(__return_storage_ptr__,&local_190);
        std::shared_ptr<SchemeObject>::~shared_ptr(&local_190);
        std::shared_ptr<SchemeObject>::~shared_ptr(&local_1a0);
        std::shared_ptr<SchemeFloat>::~shared_ptr(&local_1b0);
      }
      else {
        std::make_shared<SchemeInt,long_long&>((longlong *)&local_1e0);
        std::shared_ptr<SchemeObject>::shared_ptr<SchemeInt,void>(&local_1d0,&local_1e0);
        to_object(&local_1c0);
        ExecutionResult::ExecutionResult(__return_storage_ptr__,&local_1c0);
        std::shared_ptr<SchemeObject>::~shared_ptr(&local_1c0);
        std::shared_ptr<SchemeObject>::~shared_ptr(&local_1d0);
        std::shared_ptr<SchemeInt>::~shared_ptr(&local_1e0);
      }
      return __return_storage_ptr__;
    }
    psVar3 = std::_List_const_iterator<std::shared_ptr<SchemeObject>_>::operator*(&__end1);
    std::shared_ptr<SchemeObject>::shared_ptr((shared_ptr<SchemeObject> *)local_78,psVar3);
    std::shared_ptr<SchemeObject>::shared_ptr(&local_88,(shared_ptr<SchemeObject> *)local_78);
    local_a9 = 0;
    bVar2 = is_int(&local_88);
    local_209 = 0;
    if (!bVar2) {
      std::shared_ptr<SchemeObject>::shared_ptr(local_a8,(shared_ptr<SchemeObject> *)local_78);
      local_a9 = 1;
      bVar2 = is_float(local_a8);
      local_209 = bVar2 ^ 0xff;
    }
    if ((local_a9 & 1) != 0) {
      std::shared_ptr<SchemeObject>::~shared_ptr(local_a8);
    }
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_88);
    if ((local_209 & 1) != 0) break;
    if ((n._7_1_ & 1) == 0) {
      std::shared_ptr<SchemeObject>::shared_ptr(&local_140,(shared_ptr<SchemeObject> *)local_78);
      bVar2 = is_float(&local_140);
      std::shared_ptr<SchemeObject>::~shared_ptr(&local_140);
      if (bVar2) {
        bVar1 = true;
        std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)&local_150);
        peVar5 = std::__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_150);
        dStack_48 = (*df)(dStack_48,peVar5->value);
        std::shared_ptr<SchemeFloat>::~shared_ptr(&local_150);
      }
      else if (bVar1) {
        std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_160);
        peVar6 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_160);
        dStack_48 = (*df)(dStack_48,(double)peVar6->value);
        std::shared_ptr<SchemeInt>::~shared_ptr(&local_160);
      }
      else {
        std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_170);
        peVar6 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_170);
        d = (double)(*llf)((longlong)d,peVar6->value);
        std::shared_ptr<SchemeInt>::~shared_ptr(&local_170);
        std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_180);
        peVar6 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_180);
        dStack_48 = (*df)(dStack_48,(double)peVar6->value);
        std::shared_ptr<SchemeInt>::~shared_ptr(&local_180);
      }
      local_12c = 0;
    }
    else {
      std::shared_ptr<SchemeObject>::shared_ptr(&local_108,(shared_ptr<SchemeObject> *)local_78);
      bVar2 = is_float(&local_108);
      std::shared_ptr<SchemeObject>::~shared_ptr(&local_108);
      if (bVar2) {
        bVar1 = true;
        std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)&local_118);
        peVar5 = std::__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_118);
        dStack_48 = peVar5->value;
        std::shared_ptr<SchemeFloat>::~shared_ptr(&local_118);
      }
      else {
        std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&local_128);
        peVar6 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_128);
        d = (double)peVar6->value;
        dStack_48 = (double)(long)d;
        std::shared_ptr<SchemeInt>::~shared_ptr(&local_128);
      }
      n._7_1_ = 0;
      local_12c = 3;
    }
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_78);
    std::_List_const_iterator<std::shared_ptr<SchemeObject>_>::operator++(&__end1);
  }
  local_f1 = 1;
  this = (eval_error *)__cxa_allocate_exception(0x10);
  peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_78);
  (*peVar4->_vptr_SchemeObject[2])(&local_f0);
  std::operator+(&local_d0,&local_f0," is not an number");
  eval_error::runtime_error(this,&local_d0);
  local_f1 = 0;
  __cxa_throw(this,&eval_error::typeinfo,eval_error::~eval_error);
}

Assistant:

static ExecutionResult fold(const std::list<std::shared_ptr<SchemeObject>> &l, long long start,
                            long long (*llf)(long long, long long), double (*df)(double, double),
                            bool start_with_first = false)
{
    long long n = start;
    double d = start;
    bool is_double = false;
    for(auto i : l)
    {
        if(!is_int(i) && !is_float(i))
        {
            throw eval_error(i->external_repr() + " is not an number");
        }
        if(start_with_first)
        {
            if(is_float(i))
            {
                is_double = true;
                d = std::dynamic_pointer_cast<SchemeFloat>(i)->value;
            }
            else
            {
                d = n = std::dynamic_pointer_cast<SchemeInt>(i)->value;
            }
            start_with_first = false;
            continue;
        }
        if(is_float(i))
        {
            is_double = true;
            d = df(d, std::dynamic_pointer_cast<SchemeFloat>(i)->value);
        }
        else if(is_double)
        {
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
        else
        {
            n = llf(n, std::dynamic_pointer_cast<SchemeInt>(i)->value);
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
    }
    if(is_double)
        return to_object(std::make_shared<SchemeFloat>(d));
    else
        return to_object(std::make_shared<SchemeInt>(n));
}